

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::ElemSegment::ElemSegment(ElemSegment *this,ElemDesc *desc,Ptr *inst)

{
  RefVec *this_00;
  pointer pEVar1;
  Ref *__args;
  iterator __position;
  ElemExpr *elem_expr;
  pointer pEVar2;
  
  this->desc_ = desc;
  this_00 = &this->elements_;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::reserve
            (this_00,(long)(desc->elements).
                           super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(desc->elements).
                           super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  pEVar2 = (desc->elements).
           super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (desc->elements).
           super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pEVar2 == pEVar1) {
      return;
    }
    if (pEVar2->kind == RefFunc) {
      __args = (inst->obj_->funcs_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_start + pEVar2->index;
      __position._M_current =
           (this->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->elements_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
        _M_realloc_insert<wabt::interp::Ref&>
                  ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)this_00,__position
                   ,__args);
      }
      else {
        (__position._M_current)->index = __args->index;
LAB_0019c094:
        (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    else if (pEVar2->kind == RefNull) {
      __position._M_current =
           (this->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (this->elements_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        (__position._M_current)->index = 0;
        goto LAB_0019c094;
      }
      std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
      _M_realloc_insert<wabt::interp::Ref_const&>
                ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)this_00,__position,
                 (Ref *)&Ref::Null);
    }
    pEVar2 = pEVar2 + 1;
  } while( true );
}

Assistant:

ElemSegment::ElemSegment(const ElemDesc* desc, Instance::Ptr& inst)
    : desc_(desc) {
  elements_.reserve(desc->elements.size());
  for (auto&& elem_expr : desc->elements) {
    switch (elem_expr.kind) {
      case ElemKind::RefNull:
        elements_.emplace_back(Ref::Null);
        break;

      case ElemKind::RefFunc:
        elements_.emplace_back(inst->funcs_[elem_expr.index]);
        break;
    }
  }
}